

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleRsRule(TokenKind kind)

{
  bool bVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  bVar1 = true;
  if ((((iVar2 != 2) && (iVar2 != 0xd)) && (iVar2 != 0x53)) &&
     (((iVar2 != 0x73 && (iVar2 != 0xb6)) && ((iVar2 != 0xf9 && (iVar2 != 0x104)))))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossibleRsRule(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenBrace:
        case TokenKind::IfKeyword:
        case TokenKind::RepeatKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::Identifier:
        case TokenKind::RandKeyword:
        case TokenKind::Or:
            return true;
        default:
            return false;
    }
}